

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6.c
# Opt level: O3

int lrtr_ipv6_addr_to_str(lrtr_ipv6_addr *ip_addr,char *b,uint len)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ushort uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  uint16_t words [8];
  ushort auStack_48 [12];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = -1;
  if (len < 0x2e) goto LAB_00105878;
  bVar6 = 0;
  uVar9 = 0;
  iVar5 = 0;
  uVar10 = 0;
  iVar3 = 0;
  uVar12 = 0;
  do {
    uVar11 = (ushort)(ip_addr->addr[uVar9 >> 1 & 0x7fffffff] >> (~bVar6 & 0x10));
    auStack_48[uVar9] = uVar11;
    if (uVar11 == 0) {
      if (iVar5 == 0) {
        uVar10 = uVar9 & 0xffffffff;
      }
      if (iVar3 <= iVar5) {
        uVar12 = uVar10;
      }
      iVar8 = iVar5 + 1;
      bVar2 = iVar3 <= iVar5;
      iVar5 = iVar8;
      if (bVar2) {
        iVar3 = iVar8;
      }
    }
    else {
      iVar5 = 0;
    }
    uVar9 = uVar9 + 1;
    bVar6 = bVar6 + 0x10;
  } while (uVar9 != 8);
  iVar5 = (int)uVar12;
  if (iVar3 < 2) {
    iVar5 = -1;
  }
  if (iVar5 == 0) {
    if (iVar3 == 5) {
      if (ip_addr->addr[2] == 0xffff) {
        pcVar7 = "ffff:";
        goto LAB_001058a9;
      }
      goto LAB_001057ef;
    }
    if (iVar3 != 6) goto LAB_001057ef;
    pcVar7 = "ffff:";
    if (ip_addr->addr[2] == 0) {
      pcVar7 = "";
    }
LAB_001058a9:
    uVar1 = ip_addr->addr[3];
    sprintf(b,"::%s%d.%d.%d.%d",pcVar7,(ulong)(uVar1 >> 0x18),(ulong)(uVar1 >> 0x10 & 0xff),
            (ulong)(uVar1 >> 8 & 0xff),uVar1 & 0xff);
  }
  else {
LAB_001057ef:
    iVar8 = iVar3 + iVar5 + -1;
    iVar3 = 0;
    do {
      if (iVar3 == iVar5) {
        *b = ':';
        if (iVar8 == 7) {
          b[1] = ':';
          b = b + 2;
          break;
        }
        b = b + 1;
        iVar4 = iVar8;
      }
      else {
        if (iVar3 != 0) {
          *b = ':';
          b = b + 1;
        }
        iVar4 = sprintf(b,"%x",(ulong)auStack_48[iVar3]);
        b = b + iVar4;
        iVar4 = iVar3;
      }
      iVar3 = iVar4 + 1;
    } while (iVar4 < 7);
    *b = '\0';
  }
  iVar5 = 0;
LAB_00105878:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

int lrtr_ipv6_addr_to_str(const struct lrtr_ipv6_addr *ip_addr, char *b, const unsigned int len)
{
	if (len < INET6_ADDRSTRLEN)
		return -1;
	const uint32_t *a = ip_addr->addr;
	uint16_t words[8];
	int bestpos = 0;
	int bestlen = 0;
	int curpos = 0;
	int curlen = 0;
	int i;

	/* First of all, preprocess the address and find the longest run of zeros */
	for (i = 0; i < 8; i++) {
		uint32_t x = a[i / 2];

		words[i] = ((i % 2) ? x : (x >> 16)) & 0xffff;
		if (words[i]) {
			curlen = 0;
		} else {
			if (!curlen)
				curpos = i;
			curlen++;
			if (curlen > bestlen) {
				bestpos = curpos;
				bestlen = curlen;
			}
		}
	}
	if (bestlen < 2)
		bestpos = -1;

	/* Is it an encapsulated IPv4 address? */
	if (!bestpos && ((bestlen == 5 && a[2] == 0xffff) || bestlen == 6))
	// if (!bestpos && ((bestlen == 5 && (a[2] == 0xffff)) || bestlen == 6))
	{
		uint32_t x = a[3];

		b += sprintf(b, "::%s%d.%d.%d.%d", a[2] ? "ffff:" : "", ((x >> 24) & 0xff), ((x >> 16) & 0xff),
			     ((x >> 8) & 0xff), (x & 0xff));
		return 0;
	}

	/* Normal IPv6 formatting, compress the largest sequence of zeros */
	for (i = 0; i < 8; i++) {
		if (i == bestpos) {
			i += bestlen - 1;
			*b++ = ':';
			if (i == 7)
				*b++ = ':';
		} else {
			if (i)
				*b++ = ':';
			b += sprintf(b, "%x", words[i]);
		}
	}
	*b = '\0';
	return 0;
}